

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O1

void Cba_BlastConst(Cba_Ntk_t *p,Vec_Int_t *vOut,int iFon,int nTotal,int fSigned)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *__s;
  size_t sVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  
  if (-1 < iFon) {
    __assert_fail("Cba_FonIsConst(f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                  ,0x10c,"int Cba_FonConst(int)");
  }
  __s = Abc_NamStr(p->pDesign->pFuns,~iFon);
  sVar4 = strlen(__s);
  iVar2 = atoi(__s);
  if (iVar2 <= nTotal) {
    pcVar7 = __s + sVar4;
    do {
      pcVar6 = __s;
      __s = pcVar6 + 1;
    } while ((byte)(*pcVar6 - 0x30U) < 10);
    if (*pcVar6 == '\'') {
      pcVar6 = pcVar6 + 2;
      if (*__s != 's') {
        pcVar6 = __s;
      }
      vOut->nSize = 0;
      cVar1 = *pcVar6;
      if (cVar1 == 'b') {
        while (pcVar7 = pcVar7 + -1, pcVar6 < pcVar7) {
          Vec_IntPush(vOut,(uint)(*pcVar7 != '0'));
        }
      }
      else {
        if (cVar1 == 'd') {
          uVar3 = atoi(pcVar6 + 1);
          uVar5 = 0;
          do {
            Vec_IntPush(vOut,(uint)((uVar3 >> (uVar5 & 0x1f) & 1) != 0));
            uVar5 = uVar5 + 1;
          } while (uVar5 != 0x20);
          iVar2 = vOut->nSize;
        }
        else {
          if (cVar1 != 'h') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                          ,0x73,"void Cba_BlastConst(Cba_Ntk_t *, Vec_Int_t *, int, int, int)");
          }
          while (pcVar7 = pcVar7 + -1, pcVar6 < pcVar7) {
            uVar3 = Cba_ReadHexDigit(*pcVar7);
            uVar5 = 0;
            do {
              Vec_IntPush(vOut,(uint)((uVar3 >> (uVar5 & 0x1f) & 1) != 0));
              uVar5 = uVar5 + 1;
            } while (uVar5 != 4);
          }
          iVar2 = vOut->nSize;
        }
        if (nTotal < iVar2) {
          vOut->nSize = nTotal;
        }
      }
      if (fSigned != 0) {
        uVar3 = vOut->nSize;
        if ((int)uVar3 < nTotal) {
          if (0 < (int)uVar3) {
            Vec_IntFillExtra(vOut,nTotal - uVar3,vOut->pArray[(ulong)uVar3 - 1]);
            return;
          }
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
        }
      }
      return;
    }
    __assert_fail("*pConst == \'\\\'\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                  ,0x55,"void Cba_BlastConst(Cba_Ntk_t *, Vec_Int_t *, int, int, int)");
  }
  __assert_fail("nBits <= nTotal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                ,0x52,"void Cba_BlastConst(Cba_Ntk_t *, Vec_Int_t *, int, int, int)");
}

Assistant:

void Cba_BlastConst( Cba_Ntk_t * p, Vec_Int_t * vOut, int iFon, int nTotal, int fSigned )
{
    char * pConst = Cba_NtkConst(p, Cba_FonConst(iFon));
    char * pLimit = pConst + strlen(pConst);
    int i, Number, nBits = atoi( pConst );
    assert( nBits <= nTotal );
    while ( *pConst >= '0' && *pConst <= '9' )
        pConst++;
    assert( *pConst == '\'' );
    pConst++;
    if ( *pConst == 's' ) // assume signedness is already used in setting fSigned
        pConst++;
    Vec_IntClear( vOut );
    if ( *pConst == 'b' )
    {
        while ( --pLimit > pConst )
            Vec_IntPush( vOut, *pLimit == '0' ? 0 : 1 );
    }
    else if ( *pConst == 'h' )
    {
        while ( --pLimit > pConst )
        {
            Number = Cba_ReadHexDigit( *pLimit );
            for ( i = 0; i < 4; i++ )
                Vec_IntPush( vOut, (Number >> i) & 1 );
        }
        if ( Vec_IntSize(vOut) > nTotal )
            Vec_IntShrink( vOut, nTotal );
    }
    else if ( *pConst == 'd' )
    {
        Number = atoi( pConst+1 );
        assert( Number <= 0x7FFFFFFF );
        for ( i = 0; i < 32; i++ )
            Vec_IntPush( vOut, (Number >> i) & 1 );
        if ( Vec_IntSize(vOut) > nTotal )
            Vec_IntShrink( vOut, nTotal );
    }
    else assert( 0 );
    if ( fSigned && Vec_IntSize(vOut) < nTotal )
        Vec_IntFillExtra( vOut, nTotal - Vec_IntSize(vOut), Vec_IntEntryLast(vOut) );
}